

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyply.h
# Opt level: O0

void __thiscall tinyply::PlyFile::PlyFileImpl::write_binary_internal(PlyFileImpl *this,ostream *os)

{
  size_t sVar1;
  ostream *poVar2;
  bool bVar3;
  reference pPVar4;
  reference this_00;
  element_type *peVar5;
  uint8_t *puVar6;
  element_type *peVar7;
  size_t local_b0;
  element_type *local_a8;
  ParsingHelper *helper;
  value_type *f;
  PlyProperty *p;
  iterator __end3;
  iterator __begin3;
  vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_> *__range3;
  size_t property_index;
  size_t i;
  PlyElement *e;
  iterator __end1;
  iterator __begin1;
  vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_> *__range1;
  size_t element_idx;
  vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
  element_property_lookup;
  size_t dummyCount;
  ostream *poStack_18;
  uint8_t listSize [4];
  ostream *os_local;
  PlyFileImpl *this_local;
  
  this->isBinary = true;
  poStack_18 = os;
  write_header(this,os);
  dummyCount._4_4_ = 0;
  element_property_lookup.
  super__Vector_base<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  make_property_lookup_table
            ((vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
              *)&element_idx,this);
  __range1 = (vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_> *)0x0;
  __end1 = std::vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>::begin
                     (&this->elements);
  e = (PlyElement *)
      std::vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>::end(&this->elements);
  while (bVar3 = __gnu_cxx::
                 operator==<tinyply::PlyElement_*,_std::vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>_>
                           (&__end1,(__normal_iterator<tinyply::PlyElement_*,_std::vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>_>
                                     *)&e), ((bVar3 ^ 0xffU) & 1) != 0) {
    pPVar4 = __gnu_cxx::
             __normal_iterator<tinyply::PlyElement_*,_std::vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>_>
             ::operator*(&__end1);
    for (property_index = 0; property_index < pPVar4->size; property_index = property_index + 1) {
      __range3 = (vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_> *)0x0;
      __end3 = std::vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>::begin
                         (&pPVar4->properties);
      p = (PlyProperty *)
          std::vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>::end
                    (&pPVar4->properties);
      while (bVar3 = __gnu_cxx::
                     operator==<tinyply::PlyProperty_*,_std::vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>_>
                               (&__end3,(__normal_iterator<tinyply::PlyProperty_*,_std::vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>_>
                                         *)&p), ((bVar3 ^ 0xffU) & 1) != 0) {
        f = (value_type *)
            __gnu_cxx::
            __normal_iterator<tinyply::PlyProperty_*,_std::vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>_>
            ::operator*(&__end3);
        this_00 = std::
                  vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
                  ::operator[]((vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
                                *)&element_idx,(size_type)__range1);
        helper = (ParsingHelper *)
                 std::
                 vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>
                 ::operator[](this_00,(size_type)__range3);
        poVar2 = poStack_18;
        local_a8 = (helper->data).super___shared_ptr<tinyply::PlyData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        if ((((ulong)(helper->data).super___shared_ptr<tinyply::PlyData,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi & 1) == 0) && (local_a8 != (element_type *)0x0)) {
          if (((ulong)f[1].helper & 0x100) == 0) {
            peVar5 = std::
                     __shared_ptr_access<tinyply::PlyData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<tinyply::PlyData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a8);
            puVar6 = Buffer::get_const(&peVar5->buffer);
            peVar7 = std::
                     __shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(local_a8->buffer).data);
            sVar1 = peVar7->byteOffset;
            peVar7 = std::
                     __shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(local_a8->buffer).data);
            write_property_binary
                      (this,poVar2,puVar6 + sVar1,&peVar7->byteOffset,(size_t *)&helper->cursor);
          }
          else {
            dummyCount._4_4_ = *(undefined4 *)&f[1].skip;
            write_property_binary
                      (this,poStack_18,(uint8_t *)((long)&dummyCount + 4),
                       (size_t *)
                       &element_property_lookup.
                        super__Vector_base<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (size_t *)
                       &(helper->cursor).
                        super___shared_ptr<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            poVar2 = poStack_18;
            peVar5 = std::
                     __shared_ptr_access<tinyply::PlyData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<tinyply::PlyData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_a8);
            puVar6 = Buffer::get_const(&peVar5->buffer);
            peVar7 = std::
                     __shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(local_a8->buffer).data);
            sVar1 = peVar7->byteOffset;
            peVar7 = std::
                     __shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(local_a8->buffer).data);
            local_b0 = (long)(helper->cursor).
                             super___shared_ptr<tinyply::PlyFile::PlyFileImpl::PlyDataCursor,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr * *(long *)&f[1].skip;
            write_property_binary(this,poVar2,puVar6 + sVar1,&peVar7->byteOffset,&local_b0);
          }
          __range3 = (vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_> *)
                     ((long)&(__range3->
                             super__Vector_base<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
        }
        __gnu_cxx::
        __normal_iterator<tinyply::PlyProperty_*,_std::vector<tinyply::PlyProperty,_std::allocator<tinyply::PlyProperty>_>_>
        ::operator++(&__end3);
      }
    }
    __range1 = (vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_> *)
               ((long)&(__range1->
                       super__Vector_base<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<tinyply::PlyElement_*,_std::vector<tinyply::PlyElement,_std::allocator<tinyply::PlyElement>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
  ::~vector((vector<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>,_std::allocator<std::vector<tinyply::PlyFile::PlyFileImpl::PropertyLookup,_std::allocator<tinyply::PlyFile::PlyFileImpl::PropertyLookup>_>_>_>
             *)&element_idx);
  return;
}

Assistant:

void PlyFile::PlyFileImpl::write_binary_internal(std::ostream & os) noexcept
{
    isBinary = true;

    write_header(os);

    uint8_t listSize[4] = { 0, 0, 0, 0 };
    size_t dummyCount = 0;

    auto element_property_lookup = make_property_lookup_table();

    size_t element_idx = 0;
    for (auto & e : elements)
    {
        for (size_t i = 0; i < e.size; ++i)
        {
            size_t property_index = 0;
            for (auto & p : e.properties)
            {
                auto & f = element_property_lookup[element_idx][property_index];
                auto * helper = f.helper;
                if (f.skip || helper == nullptr) continue;

                if (p.isList)
                {
                    std::memcpy(listSize, &p.listCount, sizeof(uint32_t));
                    write_property_binary(os, listSize, dummyCount, f.list_stride);
                    write_property_binary(os, (helper->data->buffer.get_const() + helper->cursor->byteOffset), helper->cursor->byteOffset, f.prop_stride * p.listCount);
                }
                else
                {
                    write_property_binary(os, (helper->data->buffer.get_const() + helper->cursor->byteOffset), helper->cursor->byteOffset, f.prop_stride);
                }
                property_index++;
            }
        }
        element_idx++;
    }
}